

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O3

CURLcode Curl_cpool_add_conn(Curl_easy *data,connectdata *conn)

{
  undefined1 *puVar1;
  Curl_share *pCVar2;
  char *__src;
  Curl_llist_node *__n;
  hash_function p_Var3;
  Curl_llist *pCVar4;
  void *pvVar5;
  Curl_multi *pCVar6;
  Curl_hash *h;
  CURLcode CVar7;
  
  if (data == (Curl_easy *)0x0) {
    return CURLE_FAILED_INIT;
  }
  pCVar2 = data->share;
  if ((pCVar2 == (Curl_share *)0x0) || ((pCVar2->specifier & 0x20) == 0)) {
    pCVar6 = data->multi_easy;
    if ((pCVar6 == (Curl_multi *)0x0) && (pCVar6 = data->multi, pCVar6 == (Curl_multi *)0x0)) {
      return CURLE_FAILED_INIT;
    }
    h = &(pCVar6->cpool).dest2bundle;
  }
  else {
    h = &(pCVar2->cpool).dest2bundle;
  }
  if ((h[2].size != 0) && ((*(byte *)(h[2].size + 4) & 0x20) != 0)) {
    Curl_share_lock((Curl_easy *)h[2].dtor,CURL_LOCK_DATA_CONNECT,CURL_LOCK_ACCESS_SINGLE);
  }
  *(byte *)&h[3].hash_func = *(byte *)&h[3].hash_func | 1;
  pCVar4 = (Curl_llist *)Curl_hash_pick(h,conn->destination,conn->destination_len);
  if (pCVar4 == (Curl_llist *)0x0) {
    __src = conn->destination;
    __n = (Curl_llist_node *)conn->destination_len;
    pCVar4 = (Curl_llist *)(*Curl_ccalloc)(1,(size_t)&__n[1]._prev);
    CVar7 = CURLE_OUT_OF_MEMORY;
    if (pCVar4 == (Curl_llist *)0x0) goto LAB_001197e6;
    Curl_llist_init(pCVar4,(Curl_llist_dtor)0x0);
    pCVar4[1]._head = __n;
    memcpy(&pCVar4[1]._tail,__src,(size_t)__n);
    pvVar5 = Curl_hash_add(h,&pCVar4[1]._tail,(size_t)__n,pCVar4);
    if (pvVar5 == (void *)0x0) {
      (*Curl_cfree)(pCVar4);
      goto LAB_001197e6;
    }
  }
  Curl_llist_append(pCVar4,conn,&conn->cpool_node);
  puVar1 = &(conn->bits).field_0x4;
  *puVar1 = *puVar1 | 2;
  pCVar4 = h[1].table;
  p_Var3 = h[1].hash_func;
  conn->connection_id = (curl_off_t)p_Var3;
  h[1].table = (Curl_llist *)((long)&pCVar4->_head + 1);
  h[1].hash_func = p_Var3 + 1;
  CVar7 = CURLE_OK;
LAB_001197e6:
  *(byte *)&h[3].hash_func = *(byte *)&h[3].hash_func & 0xfe;
  if ((h[2].size != 0) && ((*(byte *)(h[2].size + 4) & 0x20) != 0)) {
    Curl_share_unlock((Curl_easy *)h[2].dtor,CURL_LOCK_DATA_CONNECT);
  }
  return CVar7;
}

Assistant:

CURLcode Curl_cpool_add_conn(struct Curl_easy *data,
                             struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  struct cpool_bundle *bundle = NULL;
  struct cpool *cpool = cpool_get_instance(data);
  DEBUGASSERT(conn);

  DEBUGASSERT(cpool);
  if(!cpool)
    return CURLE_FAILED_INIT;

  CPOOL_LOCK(cpool);
  bundle = cpool_find_bundle(cpool, conn);
  if(!bundle) {
    bundle = cpool_add_bundle(cpool, conn);
    if(!bundle) {
      result = CURLE_OUT_OF_MEMORY;
      goto out;
    }
  }

  cpool_bundle_add(bundle, conn);
  conn->connection_id = cpool->next_connection_id++;
  cpool->num_conn++;
  DEBUGF(infof(data, "Added connection %" FMT_OFF_T ". "
               "The cache now contains %zu members",
               conn->connection_id, cpool->num_conn));
out:
  CPOOL_UNLOCK(cpool);

  return result;
}